

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void yydestruct(char *yymsg,yysymbol_kind_t yykind,YYSTYPE *yyvaluep,YYLTYPE *yylocationp)

{
  YYLTYPE *yylocationp_local;
  YYSTYPE *yyvaluep_local;
  yysymbol_kind_t yykind_local;
  char *yymsg_local;
  
  return;
}

Assistant:

static void
yydestruct (const char *yymsg,
            yysymbol_kind_t yykind, YYSTYPE *yyvaluep, YYLTYPE *yylocationp)
{
  YY_USE (yyvaluep);
  YY_USE (yylocationp);
  if (!yymsg)
    yymsg = "Deleting";
  YY_SYMBOL_PRINT (yymsg, yykind, yyvaluep, yylocationp);

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  YY_USE (yykind);
  YY_IGNORE_MAYBE_UNINITIALIZED_END
}